

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

optional<Rgba> parseColor(string *str,size_type *n,uint16_t i)

{
  char cVar1;
  ulong uVar2;
  optional<unsigned_char> oVar3;
  optional<unsigned_char> oVar4;
  optional<unsigned_char> oVar5;
  _Storage<Rgba,_true> extraout_EAX;
  _Storage<Rgba,_true> _Var6;
  optional<Rgba> oVar7;
  ulong uVar8;
  pointer pcVar9;
  bool bVar10;
  char *fmt;
  
  oVar3 = parseDec<unsigned_char>(str,n);
  if (((ushort)oVar3.super__Optional_base<unsigned_char,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) {
    uVar8 = (ulong)(i + 1);
    pcVar9 = (str->_M_dataplus)._M_p;
    fmt = "Failed to parse color #%u (\"%s\"): invalid red component";
  }
  else {
    uVar8 = *n;
    uVar2 = str->_M_string_length;
    if (uVar8 < uVar2) {
      do {
        cVar1 = (str->_M_dataplus)._M_p[uVar8];
        if ((cVar1 != ' ') && (cVar1 != '\t')) goto LAB_0010d23c;
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
    uVar8 = 0xffffffffffffffff;
LAB_0010d23c:
    if (uVar2 < uVar8) {
      uVar8 = uVar2;
    }
    *n = uVar8;
    if (uVar8 == str->_M_string_length) {
      uVar8 = (ulong)(i + 1);
      pcVar9 = (str->_M_dataplus)._M_p;
      fmt = "Failed to parse color #%u (\"%s\"): missing green component";
    }
    else {
      oVar4 = parseDec<unsigned_char>(str,n);
      if (((ushort)oVar4.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) {
        uVar8 = (ulong)(i + 1);
        pcVar9 = (str->_M_dataplus)._M_p;
        fmt = "Failed to parse color #%u (\"%s\"): invalid green component";
      }
      else {
        uVar8 = *n;
        uVar2 = str->_M_string_length;
        if (uVar8 < uVar2) {
          do {
            cVar1 = (str->_M_dataplus)._M_p[uVar8];
            if ((cVar1 != ' ') && (cVar1 != '\t')) goto LAB_0010d2b2;
            uVar8 = uVar8 + 1;
          } while (uVar2 != uVar8);
        }
        uVar8 = 0xffffffffffffffff;
LAB_0010d2b2:
        if (uVar2 < uVar8) {
          uVar8 = uVar2;
        }
        *n = uVar8;
        if (uVar8 == str->_M_string_length) {
          uVar8 = (ulong)(i + 1);
          pcVar9 = (str->_M_dataplus)._M_p;
          fmt = "Failed to parse color #%u (\"%s\"): missing blue component";
        }
        else {
          oVar5 = parseDec<unsigned_char>(str,n);
          if (((ushort)oVar5.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_char> >> 8 & 1) != 0) {
            _Var6 = (_Storage<Rgba,_true>)
                    ((ushort)oVar3.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_char> & 0xff |
                     ((ushort)oVar4.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_char> & 0xff) << 8 |
                     (uint)(ushort)oVar5.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                                   super__Optional_payload_base<unsigned_char> << 0x10 | 0xff000000)
            ;
            bVar10 = true;
            goto LAB_0010d2fc;
          }
          uVar8 = (ulong)(i + 1);
          pcVar9 = (str->_M_dataplus)._M_p;
          fmt = "Failed to parse color #%u (\"%s\"): invalid blue component";
        }
      }
    }
  }
  bVar10 = false;
  error(fmt,uVar8,pcVar9);
  _Var6 = extraout_EAX;
LAB_0010d2fc:
  oVar7.super__Optional_base<Rgba,_true,_true>._M_payload.super__Optional_payload_base<Rgba>.
  _M_engaged = bVar10;
  oVar7.super__Optional_base<Rgba,_true,_true>._M_payload.super__Optional_payload_base<Rgba>.
  _M_payload = _Var6;
  return (optional<Rgba>)
         oVar7.super__Optional_base<Rgba,_true,_true>._M_payload.super__Optional_payload_base<Rgba>;
}

Assistant:

static std::optional<Rgba> parseColor(std::string const &str, std::string::size_type &n,
                                      uint16_t i) {
	std::optional<uint8_t> r = parseDec<uint8_t>(str, n);
	if (!r) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid red component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	skipWhitespace(str, n);
	if (n == str.length()) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): missing green component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	std::optional<uint8_t> g = parseDec<uint8_t>(str, n);
	if (!g) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid green component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	skipWhitespace(str, n);
	if (n == str.length()) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): missing blue component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	std::optional<uint8_t> b = parseDec<uint8_t>(str, n);
	if (!b) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid blue component", i + 1,
		      str.c_str());
		return std::nullopt;
	}

	return std::optional<Rgba>{Rgba(*r, *g, *b, 0xFF)};
}